

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handler.cpp
# Opt level: O2

LOCATION Handler::CheckCapacity(PurchasedServer *purchasedServer,VirtualMachine *vm)

{
  bool bVar1;
  bool bVar2;
  LOCATION LVar3;
  LOCATION local_24 [3];
  
  if (vm->nodeType == true) {
    local_24[2] = 3;
    bVar1 = CheckCapacity(purchasedServer,vm,local_24 + 2);
    LVar3 = (uint)bVar1 + (uint)bVar1 * 2;
  }
  else {
    local_24[1] = 1;
    bVar1 = CheckCapacity(purchasedServer,vm,local_24 + 1);
    local_24[0] = NODE_B;
    bVar2 = CheckCapacity(purchasedServer,vm,local_24);
    if (bVar1 && bVar2) {
      LVar3 = ALL;
    }
    else {
      LVar3 = NODE_A;
      if (!bVar1) {
        LVar3 = (uint)bVar2 * 2;
      }
    }
  }
  return LVar3;
}

Assistant:

LOCATION Handler::CheckCapacity(const PurchasedServer &purchasedServer, const VirtualMachine &vm) {
    // 双节点
    if (vm.nodeType) return CheckCapacity(purchasedServer, vm, ALL) ? ALL : NONE;

    // 单节点
    bool a = CheckCapacity(purchasedServer, vm, NODE_A);
    bool b = CheckCapacity(purchasedServer, vm, NODE_B);
    if (a && b) return ALL;
    else if (a) return NODE_A;
    else if (b) return NODE_B;
    else return NONE;
}